

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.cpp
# Opt level: O1

void read_hrd_parameters(h264_stream_t *h,bs_t *b)

{
  sps_t *psVar1;
  byte *pbVar2;
  byte bVar3;
  uint32_t r_1;
  byte *pbVar4;
  uint uVar5;
  int iVar6;
  uint32_t r;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  bool bVar15;
  
  psVar1 = h->sps;
  pbVar4 = b->p;
  pbVar2 = b->end;
  uVar7 = b->bits_left;
  uVar5 = 0xffffffff;
  iVar11 = 0;
  do {
    uVar7 = uVar7 - 1;
    b->bits_left = uVar7;
    bVar15 = true;
    if (pbVar4 < pbVar2) {
      bVar15 = (*pbVar4 >> (uVar7 & 0x1f) & 1) == 0;
    }
    if (uVar7 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar7 = 8;
    }
    uVar5 = uVar5 + 1;
    iVar11 = iVar11 + -1;
  } while (((bool)(bVar15 & uVar5 < 0x20)) && (pbVar4 < pbVar2));
  uVar7 = 0;
  uVar5 = 0;
  if (iVar11 != -1) {
    iVar6 = -2 - iVar11;
    iVar13 = -3 - iVar11;
    uVar8 = b->bits_left;
    pbVar4 = b->p;
    uVar5 = 0;
    do {
      uVar8 = uVar8 - 1;
      b->bits_left = uVar8;
      uVar9 = 0;
      if (pbVar4 < pbVar2) {
        uVar9 = (uint)((*pbVar4 >> (uVar8 & 0x1f) & 1) != 0);
      }
      if (uVar8 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar8 = 8;
      }
      uVar5 = uVar5 | uVar9 << ((byte)iVar6 & 0x1f);
      iVar13 = iVar13 + -1;
      iVar6 = iVar6 + -1;
    } while (iVar13 != -2);
  }
  (psVar1->hrd).cpb_cnt_minus1 = ~(-1 << (~(byte)iVar11 & 0x1f)) + uVar5;
  uVar5 = b->bits_left;
  pbVar4 = b->p;
  iVar11 = 3;
  do {
    uVar5 = uVar5 - 1;
    b->bits_left = uVar5;
    uVar8 = 0;
    if (pbVar4 < pbVar2) {
      uVar8 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
    }
    if (uVar5 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar5 = 8;
    }
    uVar7 = uVar7 | uVar8 << ((byte)iVar11 & 0x1f);
    bVar15 = iVar11 != 0;
    iVar11 = iVar11 + -1;
  } while (bVar15);
  (psVar1->hrd).bit_rate_scale = uVar7;
  uVar7 = b->bits_left;
  pbVar4 = b->p;
  uVar5 = 0;
  iVar11 = 3;
  do {
    uVar7 = uVar7 - 1;
    b->bits_left = uVar7;
    uVar8 = 0;
    if (pbVar4 < pbVar2) {
      uVar8 = (uint)((*pbVar4 >> (uVar7 & 0x1f) & 1) != 0);
    }
    if (uVar7 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar7 = 8;
    }
    bVar3 = (byte)iVar11 & 0x1f;
    uVar5 = uVar5 | uVar8 << bVar3;
    bVar15 = iVar11 != 0;
    iVar11 = iVar11 + -1;
  } while (bVar15);
  (psVar1->hrd).cpb_size_scale = uVar5;
  if (-1 < (psVar1->hrd).cpb_cnt_minus1) {
    pbVar4 = b->p;
    uVar12 = (ulong)(uint)(0 << bVar3);
    do {
      uVar5 = b->bits_left;
      uVar7 = 0xffffffff;
      iVar11 = -2;
      do {
        iVar6 = iVar11;
        uVar8 = uVar7;
        uVar5 = uVar5 - 1;
        b->bits_left = uVar5;
        bVar15 = true;
        if (pbVar4 < pbVar2) {
          bVar15 = (*pbVar4 >> (uVar5 & 0x1f) & 1) == 0;
        }
        if (uVar5 == 0) {
          pbVar4 = pbVar4 + 1;
          b->p = pbVar4;
          b->bits_left = 8;
          uVar5 = 8;
        }
        uVar7 = uVar8 + 1;
      } while (((bool)(bVar15 & uVar7 < 0x20)) && (iVar11 = iVar6 + 1, pbVar4 < pbVar2));
      if (uVar7 == 0) {
        uVar5 = 0;
      }
      else {
        uVar9 = b->bits_left;
        uVar5 = 0;
        do {
          uVar9 = uVar9 - 1;
          b->bits_left = uVar9;
          uVar10 = 0;
          if (pbVar4 < pbVar2) {
            uVar10 = (uint)((*pbVar4 >> (uVar9 & 0x1f) & 1) != 0);
          }
          if (uVar9 == 0) {
            pbVar4 = pbVar4 + 1;
            b->p = pbVar4;
            b->bits_left = 8;
            uVar9 = 8;
          }
          uVar5 = uVar5 | uVar10 << ((byte)uVar8 & 0x1f);
          uVar8 = uVar8 - 1;
          iVar6 = iVar6 + -1;
        } while (iVar6 != -2);
      }
      (psVar1->hrd).bit_rate_value_minus1[uVar12] = ~(-1 << ((byte)uVar7 & 0x1f)) + uVar5;
      uVar7 = b->bits_left;
      uVar5 = 0xffffffff;
      iVar11 = -2;
      do {
        iVar6 = iVar11;
        uVar8 = uVar5;
        uVar7 = uVar7 - 1;
        b->bits_left = uVar7;
        bVar15 = true;
        if (pbVar4 < pbVar2) {
          bVar15 = (*pbVar4 >> (uVar7 & 0x1f) & 1) == 0;
        }
        if (uVar7 == 0) {
          pbVar4 = pbVar4 + 1;
          b->p = pbVar4;
          b->bits_left = 8;
          uVar7 = 8;
        }
        uVar5 = uVar8 + 1;
      } while (((bool)(bVar15 & uVar5 < 0x20)) && (iVar11 = iVar6 + 1, pbVar4 < pbVar2));
      uVar7 = 0;
      if (uVar5 == 0) {
        uVar9 = 0;
      }
      else {
        uVar10 = b->bits_left;
        uVar9 = 0;
        do {
          uVar10 = uVar10 - 1;
          b->bits_left = uVar10;
          uVar14 = 0;
          if (pbVar4 < pbVar2) {
            uVar14 = (uint)((*pbVar4 >> (uVar10 & 0x1f) & 1) != 0);
          }
          if (uVar10 == 0) {
            pbVar4 = pbVar4 + 1;
            b->p = pbVar4;
            b->bits_left = 8;
            uVar10 = 8;
          }
          uVar9 = uVar9 | uVar14 << ((byte)uVar8 & 0x1f);
          uVar8 = uVar8 - 1;
          iVar6 = iVar6 + -1;
        } while (iVar6 != -2);
      }
      (psVar1->hrd).cpb_size_value_minus1[uVar12] = ~(-1 << ((byte)uVar5 & 0x1f)) + uVar9;
      uVar5 = b->bits_left - 1;
      b->bits_left = uVar5;
      if (pbVar4 < pbVar2) {
        uVar7 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
      }
      if (uVar5 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
      }
      (psVar1->hrd).cbr_flag[uVar12] = uVar7;
      bVar15 = (long)uVar12 < (long)(psVar1->hrd).cpb_cnt_minus1;
      uVar12 = uVar12 + 1;
    } while (bVar15);
  }
  uVar7 = b->bits_left;
  pbVar4 = b->p;
  uVar5 = 0;
  iVar11 = 4;
  do {
    uVar7 = uVar7 - 1;
    b->bits_left = uVar7;
    uVar8 = 0;
    if (pbVar4 < pbVar2) {
      uVar8 = (uint)((*pbVar4 >> (uVar7 & 0x1f) & 1) != 0);
    }
    if (uVar7 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar7 = 8;
    }
    uVar5 = uVar5 | uVar8 << ((byte)iVar11 & 0x1f);
    bVar15 = iVar11 != 0;
    iVar11 = iVar11 + -1;
  } while (bVar15);
  (psVar1->hrd).initial_cpb_removal_delay_length_minus1 = uVar5;
  uVar7 = b->bits_left;
  pbVar4 = b->p;
  uVar5 = 0;
  iVar11 = 4;
  do {
    uVar7 = uVar7 - 1;
    b->bits_left = uVar7;
    uVar8 = 0;
    if (pbVar4 < pbVar2) {
      uVar8 = (uint)((*pbVar4 >> (uVar7 & 0x1f) & 1) != 0);
    }
    if (uVar7 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar7 = 8;
    }
    uVar5 = uVar5 | uVar8 << ((byte)iVar11 & 0x1f);
    bVar15 = iVar11 != 0;
    iVar11 = iVar11 + -1;
  } while (bVar15);
  (psVar1->hrd).cpb_removal_delay_length_minus1 = uVar5;
  uVar7 = b->bits_left;
  pbVar4 = b->p;
  uVar5 = 0;
  iVar11 = 4;
  do {
    uVar7 = uVar7 - 1;
    b->bits_left = uVar7;
    uVar8 = 0;
    if (pbVar4 < pbVar2) {
      uVar8 = (uint)((*pbVar4 >> (uVar7 & 0x1f) & 1) != 0);
    }
    if (uVar7 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar7 = 8;
    }
    uVar5 = uVar5 | uVar8 << ((byte)iVar11 & 0x1f);
    bVar15 = iVar11 != 0;
    iVar11 = iVar11 + -1;
  } while (bVar15);
  (psVar1->hrd).dpb_output_delay_length_minus1 = uVar5;
  uVar7 = b->bits_left;
  pbVar4 = b->p;
  uVar5 = 0;
  iVar11 = 4;
  do {
    uVar7 = uVar7 - 1;
    b->bits_left = uVar7;
    uVar8 = 0;
    if (pbVar4 < pbVar2) {
      uVar8 = (uint)((*pbVar4 >> (uVar7 & 0x1f) & 1) != 0);
    }
    if (uVar7 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar7 = 8;
    }
    uVar5 = uVar5 | uVar8 << ((byte)iVar11 & 0x1f);
    bVar15 = iVar11 != 0;
    iVar11 = iVar11 + -1;
  } while (bVar15);
  (psVar1->hrd).time_offset_length = uVar5;
  return;
}

Assistant:

void read_hrd_parameters(h264_stream_t* h, bs_t* b)
{
    sps_t* sps = h->sps;
    int SchedSelIdx;

    sps->hrd.cpb_cnt_minus1 = bs_read_ue(b);
    sps->hrd.bit_rate_scale = bs_read_u(b,4);
    sps->hrd.cpb_size_scale = bs_read_u(b,4);
    for( SchedSelIdx = 0; SchedSelIdx <= sps->hrd.cpb_cnt_minus1; SchedSelIdx++ )
    {
        sps->hrd.bit_rate_value_minus1[ SchedSelIdx ] = bs_read_ue(b);
        sps->hrd.cpb_size_value_minus1[ SchedSelIdx ] = bs_read_ue(b);
        sps->hrd.cbr_flag[ SchedSelIdx ] = bs_read_u1(b);
    }
    sps->hrd.initial_cpb_removal_delay_length_minus1 = bs_read_u(b,5);
    sps->hrd.cpb_removal_delay_length_minus1 = bs_read_u(b,5);
    sps->hrd.dpb_output_delay_length_minus1 = bs_read_u(b,5);
    sps->hrd.time_offset_length = bs_read_u(b,5);
}